

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_615ea6::HBDTemporalFilterTest::SetUp(HBDTemporalFilterTest *this)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>_>
  *p_Var2;
  __tuple_element_t<1UL,_tuple<FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>_>
  *p_Var3;
  char *expr2;
  void *pvVar4;
  AssertHelper *this_00;
  char *in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int in_stack_ffffffffffffff6c;
  AssertHelper *in_stack_ffffffffffffff70;
  unsigned_short **in_stack_ffffffffffffff78;
  int line;
  char *in_stack_ffffffffffffff90;
  Type in_stack_ffffffffffffff9c;
  AssertHelper *in_stack_ffffffffffffffa0;
  AssertHelper *this_01;
  AssertionResult local_58;
  uint local_44;
  undefined8 local_20;
  Message *in_stack_ffffffffffffffe8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffff0;
  
  testing::
  WithParamInterface<std::tuple<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>_>
  ::GetParam();
  p_Var2 = std::
           get<0ul,libaom_test::FuncParam<void(*)(yv12_buffer_config_const*,macroblockd_const*,BLOCK_SIZE,int,int,int,double_const*,mv_const*,int_const*,int,int,int,unsigned_char_const*,unsigned_int*,unsigned_short*)>,int>
                     ((tuple<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>
                       *)0x63d4a9);
  *(_func_void_yv12_buffer_config_ptr_macroblockd_ptr_BLOCK_SIZE_int_int_int_double_ptr_mv_ptr_int_ptr_int_int_int_uchar_ptr_uint_ptr_unsigned_short_ptr
    **)(in_RDI + 0x18) = p_Var2->ref_func;
  *(_func_void_yv12_buffer_config_ptr_macroblockd_ptr_BLOCK_SIZE_int_int_int_double_ptr_mv_ptr_int_ptr_int_int_int_uchar_ptr_uint_ptr_unsigned_short_ptr
    **)(in_RDI + 0x20) = p_Var2->tst_func;
  *(int *)(in_RDI + 0x28) = p_Var2->bit_depth;
  testing::
  WithParamInterface<std::tuple<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>_>
  ::GetParam();
  p_Var3 = std::
           get<1ul,libaom_test::FuncParam<void(*)(yv12_buffer_config_const*,macroblockd_const*,BLOCK_SIZE,int,int,int,double_const*,mv_const*,int_const*,int,int,int,unsigned_char_const*,unsigned_int*,unsigned_short*)>,int>
                     ((tuple<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>
                       *)0x63d4d3);
  *(__tuple_element_t<1UL,_tuple<FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>_>
    *)(in_RDI + 0x30) = *p_Var3;
  expr2 = in_RDI + 0x48;
  libaom_test::ACMRandom::DeterministicSeed();
  libaom_test::ACMRandom::Reset((ACMRandom *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  pvVar4 = aom_memalign((size_t)in_RDI,(size_t)expr2);
  *(void **)(in_RDI + 0x38) = pvVar4;
  pvVar4 = aom_memalign((size_t)in_RDI,(size_t)expr2);
  *(void **)(in_RDI + 0x40) = pvVar4;
  local_20 = 0;
  testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
            (in_RDI,expr2,in_stack_ffffffffffffff78,&in_stack_ffffffffffffff70->data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffe8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffff78 =
         (unsigned_short **)testing::AssertionResult::failure_message((AssertionResult *)0x63d58b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,
               (int)((ulong)in_RDI >> 0x20),expr2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffff0._M_head_impl,in_stack_ffffffffffffffe8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff70);
    testing::Message::~Message((Message *)0x63d5d9);
  }
  local_44 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x63d63f);
  if (local_44 == 0) {
    this_01 = (AssertHelper *)0x0;
    testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
              (in_RDI,expr2,in_stack_ffffffffffffff78,&in_stack_ffffffffffffff70->data_);
    line = (int)((ulong)in_RDI >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      this_00 = (AssertHelper *)
                testing::AssertionResult::failure_message((AssertionResult *)0x63d6ba);
      testing::internal::AssertHelper::AssertHelper
                (this_01,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,line,expr2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffff0._M_head_impl,in_stack_ffffffffffffffe8);
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0x63d708);
    }
    local_44 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x63d768);
  }
  return;
}

Assistant:

void SetUp() override {
    params_ = GET_PARAM(0);
    tf_wgt_calc_lvl_ = GET_PARAM(1);
    rnd_.Reset(ACMRandom::DeterministicSeed());
    src1_ = reinterpret_cast<uint16_t *>(
        aom_memalign(16, sizeof(uint16_t) * MAX_MB_PLANE * BH * BW));
    src2_ = reinterpret_cast<uint16_t *>(
        aom_memalign(16, sizeof(uint16_t) * MAX_MB_PLANE * BH * BW));

    ASSERT_NE(src1_, nullptr);
    ASSERT_NE(src2_, nullptr);
  }